

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

bool __thiscall QO_Manager::UseCondition(QO_Manager *this,int relsJoined,int condIndex,int relIdx)

{
  RelAttr *pRVar1;
  bool bVar2;
  Condition *pCVar3;
  int local_58;
  byte local_51;
  int firstRel_1;
  bool secondBitSet;
  bool firstBitSet;
  char *local_48;
  char *local_40;
  char *local_38;
  int local_2c;
  int local_28;
  int secondRel;
  int firstRel;
  int relIdx_local;
  int condIndex_local;
  int relsJoined_local;
  QO_Manager *this_local;
  
  secondRel = relIdx;
  firstRel = condIndex;
  relIdx_local = relsJoined;
  _condIndex_local = this;
  if (this->conds[condIndex].bRhsIsAttr == 0) {
    AttrToRelIndex(this,this->conds[condIndex].lhsAttr,&local_58);
    if (local_58 == secondRel) {
      return true;
    }
  }
  else {
    pCVar3 = this->conds + condIndex;
    local_40 = (pCVar3->lhsAttr).relName;
    local_38 = (pCVar3->lhsAttr).attrName;
    AttrToRelIndex(this,pCVar3->lhsAttr,&local_28);
    pRVar1 = &this->conds[firstRel].rhsAttr;
    _firstRel_1 = pRVar1->relName;
    local_48 = this->conds[firstRel].rhsAttr.attrName;
    AttrToRelIndex(this,*pRVar1,&local_2c);
    local_51 = IsBitSet(this,local_28,relIdx_local);
    bVar2 = IsBitSet(this,local_2c,relIdx_local);
    if (((local_51 & 1) != 0) && (local_2c == secondRel)) {
      return true;
    }
    if ((bVar2) && (local_28 == secondRel)) {
      return true;
    }
    if ((local_28 == secondRel) && (local_2c == secondRel)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool QO_Manager::UseCondition(int relsJoined, int condIndex, int relIdx){
  // If attributes on both sides, one of the attributes must fall within
  // the relation specified by relIdx, and the other must be in a relation
  // specified in relsJoined
  if(conds[condIndex].bRhsIsAttr){
    int firstRel, secondRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    AttrToRelIndex(conds[condIndex].rhsAttr, secondRel);
    bool firstBitSet = IsBitSet(firstRel, relsJoined);
    bool secondBitSet = IsBitSet(secondRel, relsJoined);
    if(firstBitSet && secondRel == relIdx)
      return true;
    else if(secondBitSet && firstRel == relIdx)
      return true;
    else if(firstRel == relIdx && secondRel == relIdx)
      return true;
  }
  // If attr-value comparison, then the condition must be of the relation
  // specified by relIdx
  else{
    int firstRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    if(firstRel == relIdx)
      return true;
  }
  return false;
}